

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O3

int ply_read_word(p_ply ply)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *fmt;
  size_t sVar5;
  
  if (((ply == (p_ply)0x0) || (ply->fp == (FILE *)0x0)) || (ply->io_mode != PLY_READ)) {
    __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x3c1,"int ply_read_word(p_ply)");
  }
  do {
    sVar5 = ply->buffer_first;
    sVar3 = strspn(ply->buffer + sVar5," \n\r\t");
    sVar1 = ply->buffer_last;
    if (sVar3 < sVar1 - sVar5) {
      sVar5 = sVar3 + sVar5;
      ply->buffer_first = sVar5;
      sVar3 = strcspn(ply->buffer + sVar5," \n\r\t");
      if (sVar1 - sVar5 <= sVar3) {
        iVar2 = BREFILL(ply);
        sVar5 = ply->buffer_first;
        if (iVar2 != 0) {
          sVar4 = strcspn(ply->buffer + sVar3 + sVar5," \n\r\t");
          if (sVar4 + sVar3 < ply->buffer_last - sVar5) {
            ply->buffer_token = sVar5;
            sVar5 = sVar4 + sVar3 + sVar5;
            ply->buffer_first = sVar5;
            ply->buffer[sVar5] = '\0';
            goto LAB_00117eca;
          }
          fmt = "Token too large";
          goto LAB_00117e21;
        }
      }
      ply->buffer_token = sVar5;
      ply->buffer_first = sVar3 + sVar5;
      ply->buffer[sVar3 + sVar5] = '\0';
LAB_00117eca:
      ply->buffer_first = ply->buffer_first + 1;
      iVar2 = ply_check_word(ply);
      return iVar2;
    }
    iVar2 = BREFILL(ply);
  } while (iVar2 != 0);
  fmt = "Unexpected end of file";
LAB_00117e21:
  ply_ferror(ply,fmt);
  return 0;
}

Assistant:

static int ply_read_word(p_ply ply) {
    size_t t = 0;
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    /* skip leading blanks */
    while (1) {
        t = strspn(BFIRST(ply), " \n\r\t");
        /* check if all buffer was made of blanks */
        if (t >= BSIZE(ply)) {
            if (!BREFILL(ply)) {
                ply_ferror(ply, "Unexpected end of file");
                return 0;
            }
        } else break;
    }
    BSKIP(ply, t);
    /* look for a space after the current word */
    t = strcspn(BFIRST(ply), " \n\r\t");
    /* if we didn't reach the end of the buffer, we are done */
    if (t < BSIZE(ply)) {
        ply_finish_word(ply, t);
        return ply_check_word(ply);
    }
    /* otherwise, try to refill buffer */
    if (!BREFILL(ply)) {
        /* if we reached the end of file, try to do with what we have */
        ply_finish_word(ply, t);
        return ply_check_word(ply);
        /* ply_ferror(ply, "Unexpected end of file"); */
        /* return 0; */
    }
    /* keep looking from where we left */
    t += strcspn(BFIRST(ply) + t, " \n\r\t");
    /* check if the token is too large for our buffer */
    if (t >= BSIZE(ply)) {
        ply_ferror(ply, "Token too large");
        return 0;
    }
    /* we are done */
    ply_finish_word(ply, t);
    return ply_check_word(ply);
}